

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O0

int ssl_srv_check_client_no_crt_notification(mbedtls_ssl_context *ssl)

{
  uchar *puVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  mbedtls_ssl_context *ssl_local;
  
  if ((((ssl->conf->endpoint != '\0') &&
       (sVar4 = ssl->in_hslen, sVar3 = mbedtls_ssl_hs_hdr_len(ssl), sVar4 == sVar3 + 3)) &&
      (ssl->in_msgtype == 0x16)) && (*ssl->in_msg == '\v')) {
    puVar1 = ssl->in_msg;
    sVar4 = mbedtls_ssl_hs_hdr_len(ssl);
    iVar2 = memcmp(puVar1 + sVar4,"",3);
    if (iVar2 == 0) {
      mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
                 ,0x1c29,"peer has no certificate");
      return 0;
    }
  }
  return -1;
}

Assistant:

MBEDTLS_CHECK_RETURN_CRITICAL
static int ssl_srv_check_client_no_crt_notification(mbedtls_ssl_context *ssl)
{
    if (ssl->conf->endpoint == MBEDTLS_SSL_IS_CLIENT) {
        return -1;
    }

    if (ssl->in_hslen   == 3 + mbedtls_ssl_hs_hdr_len(ssl) &&
        ssl->in_msgtype == MBEDTLS_SSL_MSG_HANDSHAKE    &&
        ssl->in_msg[0]  == MBEDTLS_SSL_HS_CERTIFICATE   &&
        memcmp(ssl->in_msg + mbedtls_ssl_hs_hdr_len(ssl), "\0\0\0", 3) == 0) {
        MBEDTLS_SSL_DEBUG_MSG(1, ("peer has no certificate"));
        return 0;
    }
    return -1;
}